

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O0

ptr<Value> __thiscall
PrimitiveExpression<Integer>::evaluate(PrimitiveExpression<Integer> *this,Environment *env)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  Integer local_30;
  Environment *env_local;
  PrimitiveExpression<Integer> *this_local;
  
  env_local = env;
  this_local = this;
  make<Integer,Integer&>(&local_30);
  std::shared_ptr<Value>::shared_ptr<Integer,void>
            ((shared_ptr<Value> *)this,(shared_ptr<Integer> *)&local_30);
  std::shared_ptr<Integer>::~shared_ptr((shared_ptr<Integer> *)&local_30);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        return make<T>(value);
    }